

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O1

void mbedtls_sha512_update(mbedtls_sha512_context *ctx,uchar *input,size_t ilen)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong __n;
  
  if (ilen != 0) {
    uVar1 = ctx->total[0];
    uVar2 = (uint)uVar1 & 0x7f;
    ctx->total[0] = uVar1 + ilen;
    if (CARRY8(uVar1,ilen)) {
      ctx->total[1] = ctx->total[1] + 1;
    }
    uVar3 = 0;
    if ((uVar1 & 0x7f) != 0) {
      __n = (ulong)(0x80 - uVar2);
      uVar3 = uVar2;
      if (__n <= ilen) {
        memcpy(ctx->buffer + ((uint)uVar1 & 0x7f),input,__n);
        mbedtls_sha512_process(ctx,ctx->buffer);
        input = input + __n;
        ilen = ilen - __n;
        uVar3 = 0;
      }
    }
    for (; 0x7f < ilen; ilen = ilen - 0x80) {
      mbedtls_sha512_process(ctx,input);
      input = input + 0x80;
    }
    if (ilen != 0) {
      memcpy(ctx->buffer + uVar3,input,ilen);
      return;
    }
  }
  return;
}

Assistant:

void mbedtls_sha512_update( mbedtls_sha512_context *ctx, const unsigned char *input,
                    size_t ilen )
{
    size_t fill;
    unsigned int left;

    if( ilen == 0 )
        return;

    left = (unsigned int) (ctx->total[0] & 0x7F);
    fill = 128 - left;

    ctx->total[0] += (uint64_t) ilen;

    if( ctx->total[0] < (uint64_t) ilen )
        ctx->total[1]++;

    if( left && ilen >= fill )
    {
        memcpy( (void *) (ctx->buffer + left), input, fill );
        mbedtls_sha512_process( ctx, ctx->buffer );
        input += fill;
        ilen  -= fill;
        left = 0;
    }

    while( ilen >= 128 )
    {
        mbedtls_sha512_process( ctx, input );
        input += 128;
        ilen  -= 128;
    }

    if( ilen > 0 )
        memcpy( (void *) (ctx->buffer + left), input, ilen );
}